

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicDispatchIndirect::Run(BasicDispatchIndirect *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  undefined8 *puVar4;
  bool *compile_error;
  long lVar5;
  GLuint data [8];
  GLuint data2 [4];
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nuniform uvec3 g_global_size;\nvoid main() {\n  const uint global_index = gl_GlobalInvocationID.x +\n                            gl_GlobalInvocationID.y * g_global_size.x +\n                            gl_GlobalInvocationID.z * g_global_size.x * g_global_size.y;\n  if (gl_NumWorkGroups != g_global_size) {\n    g_output[global_index] = 0xffff;\n    return;\n  }\n  g_output[global_index] = global_index;\n}"
             ,"");
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_58);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar5 = -1;
  if (bVar1) {
    bVar1 = CheckBinding(this,0);
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_dispatch_buffer);
      local_58.field_2._M_allocated_capacity = (size_type)&DAT_600000005;
      local_58.field_2._8_8_ = 0x800000007;
      local_58._M_dataplus._M_p = (pointer)0x200000001;
      local_58._M_string_length = 0x400000003;
      local_38 = 0x100000003;
      uStack_30 = 0x400000004;
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0x20,&local_58,0x88e0);
      bVar1 = CheckBinding(this,this->m_dispatch_buffer[0]);
      lVar5 = -1;
      if (bVar1) {
        glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer[1]);
        glu::CallLogWrapper::glBufferData(this_00,0x90ee,0x10,&local_38,0x88e1);
        bVar1 = CheckBinding(this,this->m_dispatch_buffer[1]);
        if (bVar1) {
          glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
          glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer[0]);
          GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_global_size")
          ;
          glu::CallLogWrapper::glUniform3ui(this_00,GVar3,1,2,3);
          bVar1 = RunIteration(this,0,6);
          if (bVar1) {
            GVar3 = glu::CallLogWrapper::glGetUniformLocation
                              (this_00,this->m_program,"g_global_size");
            glu::CallLogWrapper::glUniform3ui(this_00,GVar3,2,3,4);
            bVar1 = RunIteration(this,4,0x18);
            if (bVar1) {
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (this_00,this->m_program,"g_global_size");
              glu::CallLogWrapper::glUniform3ui(this_00,GVar3,4,5,6);
              bVar1 = RunIteration(this,0xc,0x78);
              if (bVar1) {
                glu::CallLogWrapper::glBufferSubData(this_00,0x90ee,0x14,0xc,&local_58);
                GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                  (this_00,this->m_program,"g_global_size");
                glu::CallLogWrapper::glUniform3ui(this_00,GVar3,1,2,3);
                bVar1 = RunIteration(this,0x14,6);
                if (bVar1) {
                  puVar4 = (undefined8 *)glu::CallLogWrapper::glMapBuffer(this_00,0x90ee,0x88b9);
                  *puVar4 = 0x400000004;
                  *(undefined4 *)(puVar4 + 1) = 4;
                  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90ee);
                  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                    (this_00,this->m_program,"g_global_size");
                  glu::CallLogWrapper::glUniform3ui(this_00,GVar3,4,4,4);
                  bVar1 = RunIteration(this,0,0x40);
                  if (bVar1) {
                    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer[1]);
                    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                      (this_00,this->m_program,"g_global_size");
                    glu::CallLogWrapper::glUniform3ui(this_00,GVar3,1,4,4);
                    bVar1 = RunIteration(this,4,0x10);
                    if (bVar1) {
                      glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_dispatch_buffer);
                      this->m_dispatch_buffer[0] = 0;
                      this->m_dispatch_buffer[1] = 0;
                      bVar1 = CheckBinding(this,0);
                      lVar5 = (ulong)bVar1 - 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "uniform uvec3 g_global_size;" NL "void main() {" NL
			   "  const uint global_index = gl_GlobalInvocationID.x +" NL
			   "                            gl_GlobalInvocationID.y * g_global_size.x +" NL
			   "                            gl_GlobalInvocationID.z * g_global_size.x * g_global_size.y;" NL
			   "  if (gl_NumWorkGroups != g_global_size) {" NL "    g_output[global_index] = 0xffff;" NL
			   "    return;" NL "  }" NL "  g_output[global_index] = global_index;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		if (!CheckBinding(0))
			return ERROR;

		glGenBuffers(2, m_dispatch_buffer);

		const GLuint data[]  = { 1, 2, 3, 4, 5, 6, 7, 8 };
		const GLuint data2[] = { 3, 1, 4, 4 };

		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[0]);
		glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(data), data, GL_STREAM_DRAW);
		if (!CheckBinding(m_dispatch_buffer[0]))
			return ERROR;

		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[1]);
		glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(data2), data2, GL_STREAM_READ);
		if (!CheckBinding(m_dispatch_buffer[1]))
			return ERROR;

		glUseProgram(m_program);
		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[0]);

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 1, 2, 3);
		if (!RunIteration(0, 6))
			return ERROR;

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 2, 3, 4);
		if (!RunIteration(4, 24))
			return ERROR;

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 4, 5, 6);
		if (!RunIteration(12, 120))
			return ERROR;

		glBufferSubData(GL_DISPATCH_INDIRECT_BUFFER, 20, 12, data);
		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 1, 2, 3);
		if (!RunIteration(20, 6))
			return ERROR;

		GLuint* ptr = static_cast<GLuint*>(glMapBuffer(GL_DISPATCH_INDIRECT_BUFFER, GL_WRITE_ONLY));
		*ptr++		= 4;
		*ptr++		= 4;
		*ptr++		= 4;
		glUnmapBuffer(GL_DISPATCH_INDIRECT_BUFFER);

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 4, 4, 4);
		if (!RunIteration(0, 64))
			return ERROR;

		glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer[1]);

		glUniform3ui(glGetUniformLocation(m_program, "g_global_size"), 1, 4, 4);
		if (!RunIteration(4, 16))
			return ERROR;

		glDeleteBuffers(2, m_dispatch_buffer);
		memset(m_dispatch_buffer, 0, sizeof(m_dispatch_buffer));

		if (!CheckBinding(0))
			return ERROR;

		return NO_ERROR;
	}